

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::MakeInputsBeProtoPathRelative
          (CommandLineInterface *this,DiskSourceTree *source_tree)

{
  undefined4 uVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  pointer pbVar9;
  ulong uVar10;
  bool bVar11;
  string shadowing_disk_file;
  string virtual_file;
  char local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pbVar9 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar11 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish == pbVar9;
  if (bVar11) {
    return bVar11;
  }
  lVar8 = 0;
  uVar10 = 0;
LAB_00135e79:
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  local_60[0] = '\0';
  uVar1 = google::protobuf::compiler::DiskSourceTree::DiskFileToVirtualFile
                    ((string *)source_tree,(string *)((long)&(pbVar9->_M_dataplus)._M_p + lVar8),
                     (string *)&local_50);
  switch(uVar1) {
  case 0:
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&(((this->input_files_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8));
    goto switchD_00135ecb_default;
  case 1:
    pbVar9 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,*(char **)((long)&(pbVar9->_M_dataplus)._M_p + lVar8),
                        *(long *)((long)&pbVar9->_M_string_length + lVar8));
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,": Input is shadowed in the --proto_path by \"",0x2c);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_60,0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "\".  Either use the latter file as your input or reorder the --proto_path so that the former file\'s location comes first."
               ,0x78);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    break;
  case 2:
    pbVar9 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,*(char **)((long)&(pbVar9->_M_dataplus)._M_p + lVar8),
                        *(long *)((long)&pbVar9->_M_string_length + lVar8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    break;
  case 3:
    iVar2 = access(*(char **)((long)&(((this->input_files_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar8),0);
    pbVar9 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar6 = *(char **)((long)&(pbVar9->_M_dataplus)._M_p + lVar8);
    lVar8 = *(long *)((long)&pbVar9->_M_string_length + lVar8);
    if (iVar2 < 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,pcVar6,lVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
      pcVar6 = strerror(2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar7);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    else {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,pcVar6,lVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,
                 ": File does not reside within any path specified using --proto_path (or -I).  You must specify a --proto_path which encompasses this file.  Note that the proto_path must be an exact prefix of the .proto file names -- protoc is too dumb to figure out when two paths (e.g. absolute and relative) are equivalent (it\'s harder than you think)."
                 ,0x152);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    break;
  default:
    goto switchD_00135ecb_default;
  }
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_50 == &local_40) {
    return bVar11;
  }
  operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  return bVar11;
switchD_00135ecb_default:
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  uVar10 = uVar10 + 1;
  pbVar9 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(this->input_files_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5;
  lVar8 = lVar8 + 0x20;
  bVar11 = uVar3 <= uVar10;
  if (uVar3 <= uVar10) {
    return bVar11;
  }
  goto LAB_00135e79;
}

Assistant:

bool CommandLineInterface::MakeInputsBeProtoPathRelative(
    DiskSourceTree* source_tree) {
  for (int i = 0; i < input_files_.size(); i++) {
    string virtual_file, shadowing_disk_file;
    switch (source_tree->DiskFileToVirtualFile(
        input_files_[i], &virtual_file, &shadowing_disk_file)) {
      case DiskSourceTree::SUCCESS:
        input_files_[i] = virtual_file;
        break;
      case DiskSourceTree::SHADOWED:
        cerr << input_files_[i] << ": Input is shadowed in the --proto_path "
                "by \"" << shadowing_disk_file << "\".  Either use the latter "
                "file as your input or reorder the --proto_path so that the "
                "former file's location comes first." << endl;
        return false;
      case DiskSourceTree::CANNOT_OPEN:
        cerr << input_files_[i] << ": " << strerror(errno) << endl;
        return false;
      case DiskSourceTree::NO_MAPPING:
        // First check if the file exists at all.
        if (access(input_files_[i].c_str(), F_OK) < 0) {
          // File does not even exist.
          cerr << input_files_[i] << ": " << strerror(ENOENT) << endl;
        } else {
          cerr << input_files_[i] << ": File does not reside within any path "
                  "specified using --proto_path (or -I).  You must specify a "
                  "--proto_path which encompasses this file.  Note that the "
                  "proto_path must be an exact prefix of the .proto file "
                  "names -- protoc is too dumb to figure out when two paths "
                  "(e.g. absolute and relative) are equivalent (it's harder "
                  "than you think)." << endl;
        }
        return false;
    }
  }

  return true;
}